

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bignum-dtoa.cc
# Opt level: O1

void TestBignumDtoaVariousDoubles(void)

{
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  char *pcVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  Vector<char> buffer;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  Vector<char> buffer_03;
  Vector<char> buffer_04;
  Vector<char> buffer_05;
  Vector<char> buffer_06;
  Vector<char> buffer_07;
  Vector<char> buffer_08;
  Vector<char> buffer_09;
  Vector<char> buffer_10;
  Vector<char> buffer_11;
  Vector<char> buffer_12;
  Vector<char> buffer_13;
  Vector<char> buffer_14;
  Vector<char> buffer_15;
  Vector<char> buffer_16;
  Vector<char> buffer_17;
  Vector<char> buffer_18;
  Vector<char> buffer_19;
  Vector<char> buffer_20;
  Vector<char> buffer_21;
  Vector<char> buffer_22;
  Vector<char> buffer_23;
  Vector<char> buffer_24;
  Vector<char> buffer_25;
  Vector<char> buffer_26;
  Vector<char> buffer_27;
  Vector<char> buffer_28;
  Vector<char> buffer_29;
  Vector<char> buffer_30;
  Vector<char> buffer_31;
  Vector<char> buffer_32;
  Vector<char> representation;
  Vector<char> representation_00;
  Vector<char> representation_01;
  Vector<char> representation_02;
  Vector<char> representation_03;
  Vector<char> representation_04;
  Vector<char> representation_05;
  Vector<char> representation_06;
  Vector<char> representation_07;
  Vector<char> representation_08;
  Vector<char> representation_09;
  Vector<char> representation_10;
  Vector<char> representation_11;
  Vector<char> representation_12;
  Vector<char> representation_13;
  Vector<char> representation_14;
  Vector<char> representation_15;
  Vector<char> representation_16;
  Vector<char> representation_17;
  int point;
  int length;
  char buffer_container [100];
  int *in_stack_ffffffffffffff58;
  undefined4 uVar26;
  undefined8 uVar25;
  int local_a0;
  int local_9c;
  char local_98;
  char cStack_97;
  char cStack_96;
  char cStack_95;
  char cStack_94;
  char cStack_93;
  char cStack_92;
  char cStack_91;
  char cStack_90;
  char cStack_8f;
  char cStack_8e;
  char cStack_8d;
  char cStack_8c;
  char cStack_8b;
  char cStack_8a;
  char cStack_89;
  char local_88;
  char cStack_87;
  char cStack_86;
  char cStack_85;
  char cStack_84;
  
  buffer._8_8_ = &local_9c;
  buffer.start_ = (char *)0x64;
  double_conversion::BignumDtoa
            ((double_conversion *)0x0,1.0,BIGNUM_DTOA_SHORTEST,(int)&local_98,buffer,&local_a0,
             in_stack_ffffffffffffff58);
  if (CONCAT11(cStack_97,local_98) != 0x31) {
    pcVar2 = "\"1\"";
    pcVar4 = "1";
    uVar3 = 0x41;
    goto LAB_00829abd;
  }
  if (local_a0 == 1) {
    uVar3 = 3;
    buffer_00._8_8_ = &local_9c;
    buffer_00.start_ = (char *)0x64;
    double_conversion::BignumDtoa
              ((double_conversion *)0x2,1.0,BIGNUM_DTOA_PRECISION,(int)&local_98,buffer_00,&local_a0
               ,in_stack_ffffffffffffff58);
    iVar1 = local_a0;
    if (3 < local_9c - local_a0) {
      pcVar2 = "(3) >= (length - point)";
      uVar3 = 0x45;
      goto LAB_00829a85;
    }
    representation._8_8_ = uVar3;
    representation.start_ = &local_98;
    TrimRepresentation(representation);
    if (CONCAT11(cStack_97,local_98) != 0x31) {
      pcVar2 = "\"1\"";
      pcVar4 = "1";
      uVar3 = 0x47;
      goto LAB_00829abd;
    }
    if (iVar1 == 1) {
      uVar3 = 3;
      buffer_01._8_8_ = &local_9c;
      buffer_01.start_ = (char *)0x64;
      double_conversion::BignumDtoa
                ((double_conversion *)0x3,1.0,BIGNUM_DTOA_PRECISION,(int)&local_98,buffer_01,
                 &local_a0,in_stack_ffffffffffffff58);
      if (3 < local_9c) {
        pcVar2 = "(3) >= (length)";
        uVar3 = 0x4b;
        goto LAB_00829a85;
      }
      representation_00._8_8_ = uVar3;
      representation_00.start_ = &local_98;
      TrimRepresentation(representation_00);
      if (CONCAT11(cStack_97,local_98) != 0x31) {
        pcVar2 = "\"1\"";
        pcVar4 = "1";
        uVar3 = 0x4d;
LAB_00829abd:
        printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %s\n#  Found:    %s\n",
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/ext/double-conversion/test/cctest/test-bignum-dtoa.cc"
               ,uVar3,pcVar2,"buffer.start()",pcVar4,&local_98);
        abort();
      }
      if (local_a0 == 1) {
        buffer_02._8_8_ = &local_9c;
        buffer_02.start_ = (char *)0x64;
        double_conversion::BignumDtoa
                  ((double_conversion *)0x0,1.5,BIGNUM_DTOA_SHORTEST,(int)&local_98,buffer_02,
                   &local_a0,in_stack_ffffffffffffff58);
        if (cStack_96 != '\0' || CONCAT11(cStack_97,local_98) != 0x3531) {
          pcVar2 = "\"15\"";
          pcVar4 = "15";
          uVar3 = 0x51;
          goto LAB_00829abd;
        }
        if (local_a0 == 1) {
          uVar3 = 10;
          buffer_03._8_8_ = &local_9c;
          buffer_03.start_ = (char *)0x64;
          double_conversion::BignumDtoa
                    ((double_conversion *)0x2,1.5,10,(int)&local_98,buffer_03,&local_a0,
                     in_stack_ffffffffffffff58);
          iVar1 = local_a0;
          if (10 < local_9c - local_a0) {
            pcVar2 = "(10) >= (length - point)";
            uVar3 = 0x55;
            goto LAB_00829a85;
          }
          representation_01._8_8_ = uVar3;
          representation_01.start_ = &local_98;
          TrimRepresentation(representation_01);
          if (cStack_96 != '\0' || CONCAT11(cStack_97,local_98) != 0x3531) {
            pcVar2 = "\"15\"";
            pcVar4 = "15";
            uVar3 = 0x57;
            goto LAB_00829abd;
          }
          if (iVar1 == 1) {
            uVar3 = 10;
            buffer_04._8_8_ = &local_9c;
            buffer_04.start_ = (char *)0x64;
            double_conversion::BignumDtoa
                      ((double_conversion *)0x3,1.5,10,(int)&local_98,buffer_04,&local_a0,
                       in_stack_ffffffffffffff58);
            if (10 < local_9c) {
              pcVar2 = "(10) >= (length)";
              uVar3 = 0x5b;
              goto LAB_00829a85;
            }
            representation_02._8_8_ = uVar3;
            representation_02.start_ = &local_98;
            TrimRepresentation(representation_02);
            if (cStack_96 != '\0' || CONCAT11(cStack_97,local_98) != 0x3531) {
              pcVar2 = "\"15\"";
              pcVar4 = "15";
              uVar3 = 0x5d;
              goto LAB_00829abd;
            }
            if (local_a0 == 1) {
              buffer_05._8_8_ = &local_9c;
              buffer_05.start_ = (char *)0x64;
              double_conversion::BignumDtoa
                        ((double_conversion *)0x0,4.94065645841247e-324,BIGNUM_DTOA_SHORTEST,
                         (int)&local_98,buffer_05,&local_a0,in_stack_ffffffffffffff58);
              if (CONCAT11(cStack_97,local_98) != 0x35) {
                pcVar2 = "\"5\"";
                pcVar4 = "5";
                uVar3 = 0x62;
                goto LAB_00829abd;
              }
              if (local_a0 == -0x143) {
                uVar3 = 5;
                buffer_06._8_8_ = &local_9c;
                buffer_06.start_ = (char *)0x64;
                double_conversion::BignumDtoa
                          ((double_conversion *)0x2,4.94065645841247e-324,5,(int)&local_98,buffer_06
                           ,&local_a0,in_stack_ffffffffffffff58);
                if (5 < local_9c - local_a0) {
                  pcVar2 = "(5) >= (length - point)";
                  uVar3 = 0x66;
LAB_00829a85:
                  printf("%s:%d:\n CHECK(%s) failed\n",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/ext/double-conversion/test/cctest/test-bignum-dtoa.cc"
                         ,uVar3,pcVar2);
                  abort();
                }
                representation_03._8_8_ = uVar3;
                representation_03.start_ = &local_98;
                TrimRepresentation(representation_03);
                if (local_98 != '\0') {
                  pcVar2 = "\"\"";
                  pcVar4 = "";
                  uVar3 = 0x68;
                  goto LAB_00829abd;
                }
                uVar3 = 5;
                buffer_07._8_8_ = &local_9c;
                buffer_07.start_ = (char *)0x64;
                double_conversion::BignumDtoa
                          ((double_conversion *)0x3,4.94065645841247e-324,5,(int)&local_98,buffer_07
                           ,&local_a0,in_stack_ffffffffffffff58);
                if (5 < local_9c) {
                  pcVar2 = "(5) >= (length)";
                  uVar3 = 0x6b;
                  goto LAB_00829a85;
                }
                representation_04._8_8_ = uVar3;
                representation_04.start_ = &local_98;
                TrimRepresentation(representation_04);
                if (CONCAT11(cStack_93,cStack_94) != 0x37 ||
                    CONCAT13(cStack_95,CONCAT12(cStack_96,CONCAT11(cStack_97,local_98))) !=
                    0x30343934) {
                  pcVar2 = "\"49407\"";
                  pcVar4 = "49407";
                  uVar3 = 0x6d;
                  goto LAB_00829abd;
                }
                if (local_a0 == -0x143) {
                  buffer_08._8_8_ = &local_9c;
                  buffer_08.start_ = (char *)0x64;
                  double_conversion::BignumDtoa
                            ((double_conversion *)0x0,1.79769313486232e+308,BIGNUM_DTOA_SHORTEST,
                             (int)&local_98,buffer_08,&local_a0,in_stack_ffffffffffffff58);
                  auVar6[0] = -(local_98 == '1');
                  auVar6[1] = -(cStack_97 == '7');
                  auVar6[2] = -(cStack_96 == '9');
                  auVar6[3] = -(cStack_95 == '7');
                  auVar6[4] = -(cStack_94 == '6');
                  auVar6[5] = -(cStack_93 == '9');
                  auVar6[6] = -(cStack_92 == '3');
                  auVar6[7] = -(cStack_91 == '1');
                  auVar6[8] = -(cStack_90 == '3');
                  auVar6[9] = -(cStack_8f == '4');
                  auVar6[10] = -(cStack_8e == '8');
                  auVar6[0xb] = -(cStack_8d == '6');
                  auVar6[0xc] = -(cStack_8c == '2');
                  auVar6[0xd] = -(cStack_8b == '3');
                  auVar6[0xe] = -(cStack_8a == '1');
                  auVar6[0xf] = -(cStack_89 == '5');
                  auVar16[0] = -((char)_local_88 == '7');
                  auVar16[1] = -((char)((uint)_local_88 >> 8) == '\0');
                  auVar16[2] = 0xff;
                  auVar16[3] = 0xff;
                  auVar16[4] = 0xff;
                  auVar16[5] = 0xff;
                  auVar16[6] = 0xff;
                  auVar16[7] = 0xff;
                  auVar16[8] = 0xff;
                  auVar16[9] = 0xff;
                  auVar16[10] = 0xff;
                  auVar16[0xb] = 0xff;
                  auVar16[0xc] = 0xff;
                  auVar16[0xd] = 0xff;
                  auVar16[0xe] = 0xff;
                  auVar16[0xf] = 0xff;
                  auVar16 = auVar16 & auVar6;
                  if ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                              (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) != 0xffff) {
                    pcVar2 = "\"17976931348623157\"";
                    pcVar4 = "17976931348623157";
                    uVar3 = 0x72;
                    goto LAB_00829abd;
                  }
                  if (local_a0 == 0x135) {
                    uVar3 = 7;
                    buffer_09._8_8_ = &local_9c;
                    buffer_09.start_ = (char *)0x64;
                    double_conversion::BignumDtoa
                              ((double_conversion *)0x3,1.79769313486232e+308,7,(int)&local_98,
                               buffer_09,&local_a0,in_stack_ffffffffffffff58);
                    if (7 < local_9c) {
                      pcVar2 = "(7) >= (length)";
                      uVar3 = 0x76;
                      goto LAB_00829a85;
                    }
                    representation_05._8_8_ = uVar3;
                    representation_05.start_ = &local_98;
                    TrimRepresentation(representation_05);
                    if (CONCAT17(cStack_91,
                                 CONCAT16(cStack_92,
                                          CONCAT15(cStack_93,
                                                   CONCAT14(cStack_94,
                                                            CONCAT13(cStack_95,
                                                                     CONCAT12(cStack_96,
                                                                              CONCAT11(cStack_97,
                                                                                       local_98)))))
                                         )) != 0x33393637393731) {
                      pcVar2 = "\"1797693\"";
                      pcVar4 = "1797693";
                      uVar3 = 0x78;
                      goto LAB_00829abd;
                    }
                    if (local_a0 == 0x135) {
                      buffer_10._8_8_ = &local_9c;
                      buffer_10.start_ = (char *)0x64;
                      double_conversion::BignumDtoa
                                ((double_conversion *)0x0,4294967272.0,BIGNUM_DTOA_SHORTEST,
                                 (int)&local_98,buffer_10,&local_a0,in_stack_ffffffffffffff58);
                      if (CONCAT17(cStack_8e,
                                   CONCAT16(cStack_8f,
                                            CONCAT15(cStack_90,
                                                     CONCAT14(cStack_91,
                                                              CONCAT13(cStack_92,
                                                                       CONCAT12(cStack_93,
                                                                                CONCAT11(cStack_94,
                                                                                         cStack_95))
                                                                      ))))) != 0x32373237363934 ||
                          CONCAT17(cStack_91,
                                   CONCAT16(cStack_92,
                                            CONCAT15(cStack_93,
                                                     CONCAT14(cStack_94,
                                                              CONCAT13(cStack_95,
                                                                       CONCAT12(cStack_96,
                                                                                CONCAT11(cStack_97,
                                                                                         local_98)))
                                                             )))) != 0x3237363934393234) {
                        pcVar2 = "\"4294967272\"";
                        pcVar4 = "4294967272";
                        uVar3 = 0x7c;
                        goto LAB_00829abd;
                      }
                      if (local_a0 == 10) {
                        buffer_11._8_8_ = &local_9c;
                        buffer_11.start_ = (char *)0x64;
                        double_conversion::BignumDtoa
                                  ((double_conversion *)0x2,4294967272.0,5,(int)&local_98,buffer_11,
                                   &local_a0,in_stack_ffffffffffffff58);
                        auVar7[0] = -(local_98 == '4');
                        auVar7[1] = -(cStack_97 == '2');
                        auVar7[2] = -(cStack_96 == '9');
                        auVar7[3] = -(cStack_95 == '4');
                        auVar7[4] = -(cStack_94 == '9');
                        auVar7[5] = -(cStack_93 == '6');
                        auVar7[6] = -(cStack_92 == '7');
                        auVar7[7] = -(cStack_91 == '2');
                        auVar7[8] = -(cStack_90 == '7');
                        auVar7[9] = -(cStack_8f == '2');
                        auVar7[10] = -(cStack_8e == '0');
                        auVar7[0xb] = -(cStack_8d == '0');
                        auVar7[0xc] = -(cStack_8c == '0');
                        auVar7[0xd] = -(cStack_8b == '0');
                        auVar7[0xe] = -(cStack_8a == '0');
                        auVar7[0xf] = -(cStack_89 == '\0');
                        if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                                    (ushort)(auVar7[0xf] >> 7) << 0xf) != 0xffff) {
                          pcVar2 = "\"429496727200000\"";
                          pcVar4 = "429496727200000";
                          uVar3 = 0x80;
                          goto LAB_00829abd;
                        }
                        if (local_a0 == 10) {
                          uVar3 = 0xe;
                          buffer_12._8_8_ = &local_9c;
                          buffer_12.start_ = (char *)0x64;
                          double_conversion::BignumDtoa
                                    ((double_conversion *)0x3,4294967272.0,0xe,(int)&local_98,
                                     buffer_12,&local_a0,in_stack_ffffffffffffff58);
                          if (0xe < local_9c) {
                            pcVar2 = "(14) >= (length)";
                            uVar3 = 0x85;
                            goto LAB_00829a85;
                          }
                          representation_06._8_8_ = uVar3;
                          representation_06.start_ = &local_98;
                          TrimRepresentation(representation_06);
                          if (CONCAT17(cStack_8e,
                                       CONCAT16(cStack_8f,
                                                CONCAT15(cStack_90,
                                                         CONCAT14(cStack_91,
                                                                  CONCAT13(cStack_92,
                                                                           CONCAT12(cStack_93,
                                                                                    CONCAT11(
                                                  cStack_94,cStack_95))))))) != 0x32373237363934 ||
                              CONCAT17(cStack_91,
                                       CONCAT16(cStack_92,
                                                CONCAT15(cStack_93,
                                                         CONCAT14(cStack_94,
                                                                  CONCAT13(cStack_95,
                                                                           CONCAT12(cStack_96,
                                                                                    CONCAT11(
                                                  cStack_97,local_98))))))) != 0x3237363934393234) {
                            pcVar2 = "\"4294967272\"";
                            pcVar4 = "4294967272";
                            uVar3 = 0x87;
                            goto LAB_00829abd;
                          }
                          if (local_a0 == 10) {
                            buffer_13._8_8_ = &local_9c;
                            buffer_13.start_ = (char *)0x64;
                            double_conversion::BignumDtoa
                                      ((double_conversion *)0x0,4.185580496821357e+298,
                                       BIGNUM_DTOA_SHORTEST,(int)&local_98,buffer_13,&local_a0,
                                       in_stack_ffffffffffffff58);
                            if ((local_88 != '\0' ||
                                CONCAT17(cStack_91,
                                         CONCAT16(cStack_92,
                                                  CONCAT15(cStack_93,
                                                           CONCAT14(cStack_94,
                                                                    CONCAT13(cStack_95,
                                                                             CONCAT12(cStack_96,
                                                                                      CONCAT11(
                                                  cStack_97,local_98))))))) != 0x3430383535383134)
                                || CONCAT17(cStack_89,
                                            CONCAT16(cStack_8a,
                                                     CONCAT15(cStack_8b,
                                                              CONCAT14(cStack_8c,
                                                                       CONCAT13(cStack_8d,
                                                                                CONCAT12(cStack_8e,
                                                                                         CONCAT11(
                                                  cStack_8f,cStack_90))))))) != 0x3735333132383639)
                            {
                              pcVar2 = "\"4185580496821357\"";
                              pcVar4 = "4185580496821357";
                              uVar3 = 0x8c;
                              goto LAB_00829abd;
                            }
                            if (local_a0 == 299) {
                              uVar3 = 0x14;
                              buffer_14._8_8_ = &local_9c;
                              buffer_14.start_ = (char *)0x64;
                              double_conversion::BignumDtoa
                                        ((double_conversion *)0x3,4.185580496821357e+298,0x14,
                                         (int)&local_98,buffer_14,&local_a0,
                                         in_stack_ffffffffffffff58);
                              if (0x14 < local_9c) {
                                pcVar2 = "(20) >= (length)";
                                uVar3 = 0x91;
                                goto LAB_00829a85;
                              }
                              representation_07._8_8_ = uVar3;
                              representation_07.start_ = &local_98;
                              TrimRepresentation(representation_07);
                              auVar17[0] = -(cStack_93 == '8');
                              auVar17[1] = -(cStack_92 == '0');
                              auVar17[2] = -(cStack_91 == '4');
                              auVar17[3] = -(cStack_90 == '9');
                              auVar17[4] = -(cStack_8f == '6');
                              auVar17[5] = -(cStack_8e == '8');
                              auVar17[6] = -(cStack_8d == '2');
                              auVar17[7] = -(cStack_8c == '1');
                              auVar17[8] = -(cStack_8b == '3');
                              auVar17[9] = -(cStack_8a == '5');
                              auVar17[10] = -(cStack_89 == '6');
                              auVar17[0xb] = -(local_88 == '7');
                              auVar17[0xc] = -(cStack_87 == '2');
                              auVar17[0xd] = -(cStack_86 == '2');
                              auVar17[0xe] = -(cStack_85 == '5');
                              auVar17[0xf] = -(cStack_84 == '\0');
                              auVar8[0] = -(local_98 == '4');
                              auVar8[1] = -(cStack_97 == '1');
                              auVar8[2] = -(cStack_96 == '8');
                              auVar8[3] = -(cStack_95 == '5');
                              auVar8[4] = -(cStack_94 == '5');
                              auVar8[5] = -(cStack_93 == '8');
                              auVar8[6] = -(cStack_92 == '0');
                              auVar8[7] = -(cStack_91 == '4');
                              auVar8[8] = -(cStack_90 == '9');
                              auVar8[9] = -(cStack_8f == '6');
                              auVar8[10] = -(cStack_8e == '8');
                              auVar8[0xb] = -(cStack_8d == '2');
                              auVar8[0xc] = -(cStack_8c == '1');
                              auVar8[0xd] = -(cStack_8b == '3');
                              auVar8[0xe] = -(cStack_8a == '5');
                              auVar8[0xf] = -(cStack_89 == '6');
                              auVar8 = auVar8 & auVar17;
                              if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                                           (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                                           (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                                           (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                                           (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                                           (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                                           (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                                           (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                                           (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                                           (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                                           (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                                           (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                                           (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                                           (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                                           (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                                          (ushort)(byte)(auVar8[0xf] >> 7) << 0xf) != 0xffff) {
                                pcVar2 = "\"41855804968213567225\"";
                                pcVar4 = "41855804968213567225";
                                uVar3 = 0x93;
                                goto LAB_00829abd;
                              }
                              if (local_a0 == 299) {
                                buffer_15._8_8_ = &local_9c;
                                buffer_15.start_ = (char *)0x64;
                                double_conversion::BignumDtoa
                                          ((double_conversion *)0x0,5.562684646268003e-309,
                                           BIGNUM_DTOA_SHORTEST,(int)&local_98,buffer_15,&local_a0,
                                           in_stack_ffffffffffffff58);
                                if ((local_88 != '\0' ||
                                    CONCAT17(cStack_91,
                                             CONCAT16(cStack_92,
                                                      CONCAT15(cStack_93,
                                                               CONCAT14(cStack_94,
                                                                        CONCAT13(cStack_95,
                                                                                 CONCAT12(cStack_96,
                                                                                          CONCAT11(
                                                  cStack_97,local_98))))))) != 0x3634383632363535)
                                    || CONCAT17(cStack_89,
                                                CONCAT16(cStack_8a,
                                                         CONCAT15(cStack_8b,
                                                                  CONCAT14(cStack_8c,
                                                                           CONCAT13(cStack_8d,
                                                                                    CONCAT12(
                                                  cStack_8e,CONCAT11(cStack_8f,cStack_90))))))) !=
                                       0x3330303836323634) {
                                  pcVar2 = "\"5562684646268003\"";
                                  pcVar4 = "5562684646268003";
                                  uVar3 = 0x98;
                                  goto LAB_00829abd;
                                }
                                if (local_a0 == -0x134) {
                                  uVar3 = 1;
                                  buffer_16._8_8_ = &local_9c;
                                  buffer_16.start_ = (char *)0x64;
                                  double_conversion::BignumDtoa
                                            ((double_conversion *)0x3,5.562684646268003e-309,
                                             BIGNUM_DTOA_SHORTEST_SINGLE,(int)&local_98,buffer_16,
                                             &local_a0,in_stack_ffffffffffffff58);
                                  if (1 < local_9c) {
                                    pcVar2 = "(1) >= (length)";
                                    uVar3 = 0x9d;
                                    goto LAB_00829a85;
                                  }
                                  representation_08._8_8_ = uVar3;
                                  representation_08.start_ = &local_98;
                                  TrimRepresentation(representation_08);
                                  if (CONCAT11(cStack_97,local_98) != 0x36) {
                                    pcVar2 = "\"6\"";
                                    pcVar4 = "6";
                                    uVar3 = 0x9f;
                                    goto LAB_00829abd;
                                  }
                                  if (local_a0 == -0x134) {
                                    buffer_17._8_8_ = &local_9c;
                                    buffer_17.start_ = (char *)0x64;
                                    double_conversion::BignumDtoa
                                              ((double_conversion *)0x0,2147483648.0,
                                               BIGNUM_DTOA_SHORTEST,(int)&local_98,buffer_17,
                                               &local_a0,in_stack_ffffffffffffff58);
                                    if (CONCAT17(cStack_8e,
                                                 CONCAT16(cStack_8f,
                                                          CONCAT15(cStack_90,
                                                                   CONCAT14(cStack_91,
                                                                            CONCAT13(cStack_92,
                                                                                     CONCAT12(
                                                  cStack_93,CONCAT11(cStack_94,cStack_95))))))) !=
                                        0x38343633383437 ||
                                        CONCAT17(cStack_91,
                                                 CONCAT16(cStack_92,
                                                          CONCAT15(cStack_93,
                                                                   CONCAT14(cStack_94,
                                                                            CONCAT13(cStack_95,
                                                                                     CONCAT12(
                                                  cStack_96,CONCAT11(cStack_97,local_98))))))) !=
                                        0x3633383437343132) {
                                      pcVar2 = "\"2147483648\"";
                                      pcVar4 = "2147483648";
                                      uVar3 = 0xa4;
                                      goto LAB_00829abd;
                                    }
                                    if (local_a0 == 10) {
                                      uVar3 = 2;
                                      buffer_18._8_8_ = &local_9c;
                                      buffer_18.start_ = (char *)0x64;
                                      double_conversion::BignumDtoa
                                                ((double_conversion *)0x2,2147483648.0,
                                                 BIGNUM_DTOA_FIXED,(int)&local_98,buffer_18,
                                                 &local_a0,in_stack_ffffffffffffff58);
                                      iVar1 = local_a0;
                                      if (2 < local_9c - local_a0) {
                                        pcVar2 = "(2) >= (length - point)";
                                        uVar3 = 0xaa;
                                        goto LAB_00829a85;
                                      }
                                      representation_09._8_8_ = uVar3;
                                      representation_09.start_ = &local_98;
                                      TrimRepresentation(representation_09);
                                      if (CONCAT17(cStack_8e,
                                                   CONCAT16(cStack_8f,
                                                            CONCAT15(cStack_90,
                                                                     CONCAT14(cStack_91,
                                                                              CONCAT13(cStack_92,
                                                                                       CONCAT12(
                                                  cStack_93,CONCAT11(cStack_94,cStack_95))))))) !=
                                          0x38343633383437 ||
                                          CONCAT17(cStack_91,
                                                   CONCAT16(cStack_92,
                                                            CONCAT15(cStack_93,
                                                                     CONCAT14(cStack_94,
                                                                              CONCAT13(cStack_95,
                                                                                       CONCAT12(
                                                  cStack_96,CONCAT11(cStack_97,local_98))))))) !=
                                          0x3633383437343132) {
                                        pcVar2 = "\"2147483648\"";
                                        pcVar4 = "2147483648";
                                        uVar3 = 0xac;
                                        goto LAB_00829abd;
                                      }
                                      if (iVar1 == 10) {
                                        uVar3 = 5;
                                        buffer_19._8_8_ = &local_9c;
                                        buffer_19.start_ = (char *)0x64;
                                        double_conversion::BignumDtoa
                                                  ((double_conversion *)0x3,2147483648.0,5,
                                                   (int)&local_98,buffer_19,&local_a0,
                                                   in_stack_ffffffffffffff58);
                                        if (5 < local_9c) {
                                          pcVar2 = "(5) >= (length)";
                                          uVar3 = 0xb1;
                                          goto LAB_00829a85;
                                        }
                                        representation_10._8_8_ = uVar3;
                                        representation_10.start_ = &local_98;
                                        TrimRepresentation(representation_10);
                                        if (CONCAT11(cStack_93,cStack_94) != 0x35 ||
                                            CONCAT13(cStack_95,
                                                     CONCAT12(cStack_96,CONCAT11(cStack_97,local_98)
                                                             )) != 0x37343132) {
                                          pcVar2 = "\"21475\"";
                                          pcVar4 = "21475";
                                          uVar3 = 0xb3;
                                          goto LAB_00829abd;
                                        }
                                        if (local_a0 == 10) {
                                          buffer_20._8_8_ = &local_9c;
                                          buffer_20.start_ = (char *)0x64;
                                          double_conversion::BignumDtoa
                                                    ((double_conversion *)0x0,
                                                     3.5844466002796428e+298,BIGNUM_DTOA_SHORTEST,
                                                     (int)&local_98,buffer_20,&local_a0,
                                                     in_stack_ffffffffffffff58);
                                          auVar9[0] = -(local_98 == '3');
                                          auVar9[1] = -(cStack_97 == '5');
                                          auVar9[2] = -(cStack_96 == '8');
                                          auVar9[3] = -(cStack_95 == '4');
                                          auVar9[4] = -(cStack_94 == '4');
                                          auVar9[5] = -(cStack_93 == '4');
                                          auVar9[6] = -(cStack_92 == '6');
                                          auVar9[7] = -(cStack_91 == '6');
                                          auVar9[8] = -(cStack_90 == '0');
                                          auVar9[9] = -(cStack_8f == '0');
                                          auVar9[10] = -(cStack_8e == '2');
                                          auVar9[0xb] = -(cStack_8d == '7');
                                          auVar9[0xc] = -(cStack_8c == '9');
                                          auVar9[0xd] = -(cStack_8b == '6');
                                          auVar9[0xe] = -(cStack_8a == '4');
                                          auVar9[0xf] = -(cStack_89 == '2');
                                          auVar18[0] = -((char)_local_88 == '8');
                                          auVar18[1] = -((char)((uint)_local_88 >> 8) == '\0');
                                          auVar18[2] = 0xff;
                                          auVar18[3] = 0xff;
                                          auVar18[4] = 0xff;
                                          auVar18[5] = 0xff;
                                          auVar18[6] = 0xff;
                                          auVar18[7] = 0xff;
                                          auVar18[8] = 0xff;
                                          auVar18[9] = 0xff;
                                          auVar18[10] = 0xff;
                                          auVar18[0xb] = 0xff;
                                          auVar18[0xc] = 0xff;
                                          auVar18[0xd] = 0xff;
                                          auVar18[0xe] = 0xff;
                                          auVar18[0xf] = 0xff;
                                          auVar18 = auVar18 & auVar9;
                                          if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                                                       (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                                                       (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2
                                                       | (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) <<
                                                         3 | (ushort)(SUB161(auVar18 >> 0x27,0) & 1)
                                                             << 4 |
                                                       (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5
                                                       | (ushort)(SUB161(auVar18 >> 0x37,0) & 1) <<
                                                         6 | (ushort)(SUB161(auVar18 >> 0x3f,0) & 1)
                                                             << 7 |
                                                       (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8
                                                       | (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) <<
                                                         9 | (ushort)(SUB161(auVar18 >> 0x57,0) & 1)
                                                             << 10 |
                                                       (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) <<
                                                       0xb | (ushort)(SUB161(auVar18 >> 0x67,0) & 1)
                                                             << 0xc |
                                                       (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) <<
                                                       0xd | (ushort)(SUB161(auVar18 >> 0x77,0) & 1)
                                                             << 0xe |
                                                      (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) !=
                                              0xffff) {
                                            pcVar2 = "\"35844466002796428\"";
                                            pcVar4 = "35844466002796428";
                                            uVar3 = 0xb8;
                                            goto LAB_00829abd;
                                          }
                                          if (local_a0 == 299) {
                                            uVar3 = 10;
                                            buffer_21._8_8_ = &local_9c;
                                            buffer_21.start_ = (char *)0x64;
                                            double_conversion::BignumDtoa
                                                      ((double_conversion *)0x3,
                                                       3.5844466002796428e+298,10,(int)&local_98,
                                                       buffer_21,&local_a0,in_stack_ffffffffffffff58
                                                      );
                                            if (10 < local_9c) {
                                              pcVar2 = "(10) >= (length)";
                                              uVar3 = 0xbd;
                                              goto LAB_00829a85;
                                            }
                                            representation_11._8_8_ = uVar3;
                                            representation_11.start_ = &local_98;
                                            TrimRepresentation(representation_11);
                                            if (cStack_90 != '\0' ||
                                                CONCAT17(cStack_91,
                                                         CONCAT16(cStack_92,
                                                                  CONCAT15(cStack_93,
                                                                           CONCAT14(cStack_94,
                                                                                    CONCAT13(
                                                  cStack_95,
                                                  CONCAT12(cStack_96,CONCAT11(cStack_97,local_98))))
                                                  ))) != 0x3636343434383533) {
                                              pcVar2 = "\"35844466\"";
                                              pcVar4 = "35844466";
                                              uVar3 = 0xbf;
                                              goto LAB_00829abd;
                                            }
                                            if (local_a0 == 299) {
                                              buffer_22._8_8_ = &local_9c;
                                              buffer_22.start_ = (char *)0x64;
                                              double_conversion::BignumDtoa
                                                        ((double_conversion *)0x0,1e-23,
                                                         BIGNUM_DTOA_SHORTEST,(int)&local_98,
                                                         buffer_22,&local_a0,
                                                         in_stack_ffffffffffffff58);
                                              if (CONCAT11(cStack_97,local_98) != 0x31) {
                                                pcVar2 = "\"1\"";
                                                pcVar4 = "1";
                                                uVar3 = 0xc4;
                                                goto LAB_00829abd;
                                              }
                                              if (local_a0 != -0x16) {
                                                uVar25 = CONCAT44((int)((ulong)
                                                  in_stack_ffffffffffffff58 >> 0x20),local_a0);
                                                pcVar2 = "-22";
                                                uVar3 = 0xc5;
                                                uVar5 = 0xffffffea;
                                                goto LAB_00829886;
                                              }
                                              buffer_23._8_8_ = &local_9c;
                                              buffer_23.start_ = (char *)0x64;
                                              double_conversion::BignumDtoa
                                                        ((double_conversion *)0x0,
                                                         2.2250738585072014e-308,
                                                         BIGNUM_DTOA_SHORTEST,(int)&local_98,
                                                         buffer_23,&local_a0,
                                                         in_stack_ffffffffffffff58);
                                              auVar10[0] = -(local_98 == '2');
                                              auVar10[1] = -(cStack_97 == '2');
                                              auVar10[2] = -(cStack_96 == '2');
                                              auVar10[3] = -(cStack_95 == '5');
                                              auVar10[4] = -(cStack_94 == '0');
                                              auVar10[5] = -(cStack_93 == '7');
                                              auVar10[6] = -(cStack_92 == '3');
                                              auVar10[7] = -(cStack_91 == '8');
                                              auVar10[8] = -(cStack_90 == '5');
                                              auVar10[9] = -(cStack_8f == '8');
                                              auVar10[10] = -(cStack_8e == '5');
                                              auVar10[0xb] = -(cStack_8d == '0');
                                              auVar10[0xc] = -(cStack_8c == '7');
                                              auVar10[0xd] = -(cStack_8b == '2');
                                              auVar10[0xe] = -(cStack_8a == '0');
                                              auVar10[0xf] = -(cStack_89 == '1');
                                              auVar19[0] = -((char)_local_88 == '4');
                                              auVar19[1] = -((char)((uint)_local_88 >> 8) == '\0');
                                              auVar19[2] = 0xff;
                                              auVar19[3] = 0xff;
                                              auVar19[4] = 0xff;
                                              auVar19[5] = 0xff;
                                              auVar19[6] = 0xff;
                                              auVar19[7] = 0xff;
                                              auVar19[8] = 0xff;
                                              auVar19[9] = 0xff;
                                              auVar19[10] = 0xff;
                                              auVar19[0xb] = 0xff;
                                              auVar19[0xc] = 0xff;
                                              auVar19[0xd] = 0xff;
                                              auVar19[0xe] = 0xff;
                                              auVar19[0xf] = 0xff;
                                              auVar19 = auVar19 & auVar10;
                                              if ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                                                           (ushort)(SUB161(auVar19 >> 0xf,0) & 1) <<
                                                           1 | (ushort)(SUB161(auVar19 >> 0x17,0) &
                                                                       1) << 2 |
                                                           (ushort)(SUB161(auVar19 >> 0x1f,0) & 1)
                                                           << 3 | (ushort)(SUB161(auVar19 >> 0x27,0)
                                                                          & 1) << 4 |
                                                           (ushort)(SUB161(auVar19 >> 0x2f,0) & 1)
                                                           << 5 | (ushort)(SUB161(auVar19 >> 0x37,0)
                                                                          & 1) << 6 |
                                                           (ushort)(SUB161(auVar19 >> 0x3f,0) & 1)
                                                           << 7 | (ushort)(SUB161(auVar19 >> 0x47,0)
                                                                          & 1) << 8 |
                                                           (ushort)(SUB161(auVar19 >> 0x4f,0) & 1)
                                                           << 9 | (ushort)(SUB161(auVar19 >> 0x57,0)
                                                                          & 1) << 10 |
                                                           (ushort)(SUB161(auVar19 >> 0x5f,0) & 1)
                                                           << 0xb | (ushort)(SUB161(auVar19 >> 0x67,
                                                                                    0) & 1) << 0xc |
                                                           (ushort)(SUB161(auVar19 >> 0x6f,0) & 1)
                                                           << 0xd | (ushort)(SUB161(auVar19 >> 0x77,
                                                                                    0) & 1) << 0xe |
                                                          (ushort)(byte)(auVar19[0xf] >> 7) << 0xf)
                                                  != 0xffff) {
                                                pcVar2 = "\"22250738585072014\"";
                                                pcVar4 = "22250738585072014";
                                                uVar3 = 0xca;
                                                goto LAB_00829abd;
                                              }
                                              if (local_a0 == -0x133) {
                                                uVar3 = 0x14;
                                                buffer_24._8_8_ = &local_9c;
                                                buffer_24.start_ = (char *)0x64;
                                                double_conversion::BignumDtoa
                                                          ((double_conversion *)0x3,
                                                           2.2250738585072014e-308,0x14,
                                                           (int)&local_98,buffer_24,&local_a0,
                                                           in_stack_ffffffffffffff58);
                                                if (0x14 < local_9c) {
                                                  pcVar2 = "(20) >= (length)";
                                                  uVar3 = 0xce;
                                                  goto LAB_00829a85;
                                                }
                                                representation_12._8_8_ = uVar3;
                                                representation_12.start_ = &local_98;
                                                TrimRepresentation(representation_12);
                                                auVar11[0] = -(local_98 == '2');
                                                auVar11[1] = -(cStack_97 == '2');
                                                auVar11[2] = -(cStack_96 == '2');
                                                auVar11[3] = -(cStack_95 == '5');
                                                auVar11[4] = -(cStack_94 == '0');
                                                auVar11[5] = -(cStack_93 == '7');
                                                auVar11[6] = -(cStack_92 == '3');
                                                auVar11[7] = -(cStack_91 == '8');
                                                auVar11[8] = -(cStack_90 == '5');
                                                auVar11[9] = -(cStack_8f == '8');
                                                auVar11[10] = -(cStack_8e == '5');
                                                auVar11[0xb] = -(cStack_8d == '0');
                                                auVar11[0xc] = -(cStack_8c == '7');
                                                auVar11[0xd] = -(cStack_8b == '2');
                                                auVar11[0xe] = -(cStack_8a == '0');
                                                auVar11[0xf] = -(cStack_89 == '1');
                                                auVar20[0] = -(cStack_93 == '7');
                                                auVar20[1] = -(cStack_92 == '3');
                                                auVar20[2] = -(cStack_91 == '8');
                                                auVar20[3] = -(cStack_90 == '5');
                                                auVar20[4] = -(cStack_8f == '8');
                                                auVar20[5] = -(cStack_8e == '5');
                                                auVar20[6] = -(cStack_8d == '0');
                                                auVar20[7] = -(cStack_8c == '7');
                                                auVar20[8] = -(cStack_8b == '2');
                                                auVar20[9] = -(cStack_8a == '0');
                                                auVar20[10] = -(cStack_89 == '1');
                                                auVar20[0xb] = -(local_88 == '3');
                                                auVar20[0xc] = -(cStack_87 == '8');
                                                auVar20[0xd] = -(cStack_86 == '3');
                                                auVar20[0xe] = -(cStack_85 == '1');
                                                auVar20[0xf] = -(cStack_84 == '\0');
                                                auVar20 = auVar20 & auVar11;
                                                if ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                                                             (ushort)(SUB161(auVar20 >> 0xf,0) & 1)
                                                             << 1 | (ushort)(SUB161(auVar20 >> 0x17,
                                                                                    0) & 1) << 2 |
                                                             (ushort)(SUB161(auVar20 >> 0x1f,0) & 1)
                                                             << 3 | (ushort)(SUB161(auVar20 >> 0x27,
                                                                                    0) & 1) << 4 |
                                                             (ushort)(SUB161(auVar20 >> 0x2f,0) & 1)
                                                             << 5 | (ushort)(SUB161(auVar20 >> 0x37,
                                                                                    0) & 1) << 6 |
                                                             (ushort)(SUB161(auVar20 >> 0x3f,0) & 1)
                                                             << 7 | (ushort)(SUB161(auVar20 >> 0x47,
                                                                                    0) & 1) << 8 |
                                                             (ushort)(SUB161(auVar20 >> 0x4f,0) & 1)
                                                             << 9 | (ushort)(SUB161(auVar20 >> 0x57,
                                                                                    0) & 1) << 10 |
                                                             (ushort)(SUB161(auVar20 >> 0x5f,0) & 1)
                                                             << 0xb | (ushort)(SUB161(auVar20 >>
                                                                                      0x67,0) & 1)
                                                                      << 0xc |
                                                             (ushort)(SUB161(auVar20 >> 0x6f,0) & 1)
                                                             << 0xd | (ushort)(SUB161(auVar20 >>
                                                                                      0x77,0) & 1)
                                                                      << 0xe |
                                                            (ushort)(byte)(auVar20[0xf] >> 7) << 0xf
                                                            ) != 0xffff) {
                                                  pcVar2 = "\"22250738585072013831\"";
                                                  pcVar4 = "22250738585072013831";
                                                  uVar3 = 0xd0;
                                                  goto LAB_00829abd;
                                                }
                                                if (local_a0 == -0x133) {
                                                  buffer_25._8_8_ = &local_9c;
                                                  buffer_25.start_ = (char *)0x64;
                                                  double_conversion::BignumDtoa
                                                            ((double_conversion *)0x0,
                                                             2.225073858507201e-308,
                                                             BIGNUM_DTOA_SHORTEST,(int)&local_98,
                                                             buffer_25,&local_a0,
                                                             in_stack_ffffffffffffff58);
                                                  if ((local_88 != '\0' ||
                                                      CONCAT17(cStack_91,
                                                               CONCAT16(cStack_92,
                                                                        CONCAT15(cStack_93,
                                                                                 CONCAT14(cStack_94,
                                                                                          CONCAT13(
                                                  cStack_95,
                                                  CONCAT12(cStack_96,CONCAT11(cStack_97,local_98))))
                                                  ))) != 0x3833373035323232) ||
                                                  CONCAT17(cStack_89,
                                                           CONCAT16(cStack_8a,
                                                                    CONCAT15(cStack_8b,
                                                                             CONCAT14(cStack_8c,
                                                                                      CONCAT13(
                                                  cStack_8d,
                                                  CONCAT12(cStack_8e,CONCAT11(cStack_8f,cStack_90)))
                                                  )))) != 0x3130323730353835) {
                                                    pcVar2 = "\"2225073858507201\"";
                                                    pcVar4 = "2225073858507201";
                                                    uVar3 = 0xd6;
                                                    goto LAB_00829abd;
                                                  }
                                                  if (local_a0 == -0x133) {
                                                    uVar3 = 0x14;
                                                    buffer_26._8_8_ = &local_9c;
                                                    buffer_26.start_ = (char *)0x64;
                                                    double_conversion::BignumDtoa
                                                              ((double_conversion *)0x3,
                                                               2.225073858507201e-308,0x14,
                                                               (int)&local_98,buffer_26,&local_a0,
                                                               in_stack_ffffffffffffff58);
                                                    if (0x14 < local_9c) {
                                                      pcVar2 = "(20) >= (length)";
                                                      uVar3 = 0xda;
                                                      goto LAB_00829a85;
                                                    }
                                                    representation_13._8_8_ = uVar3;
                                                    representation_13.start_ = &local_98;
                                                    TrimRepresentation(representation_13);
                                                    auVar21[0] = -((char)_local_88 == '8');
                                                    auVar21[1] = -((char)((uint)_local_88 >> 8) ==
                                                                  '8');
                                                    auVar21[2] = -((char)((uint)_local_88 >> 0x10)
                                                                  == '9');
                                                    auVar21[3] = -((char)((uint)_local_88 >> 0x18)
                                                                  == '\0');
                                                    auVar21[4] = 0xff;
                                                    auVar21[5] = 0xff;
                                                    auVar21[6] = 0xff;
                                                    auVar21[7] = 0xff;
                                                    auVar21[8] = 0xff;
                                                    auVar21[9] = 0xff;
                                                    auVar21[10] = 0xff;
                                                    auVar21[0xb] = 0xff;
                                                    auVar21[0xc] = 0xff;
                                                    auVar21[0xd] = 0xff;
                                                    auVar21[0xe] = 0xff;
                                                    auVar21[0xf] = 0xff;
                                                    auVar12[0] = -(local_98 == '2');
                                                    auVar12[1] = -(cStack_97 == '2');
                                                    auVar12[2] = -(cStack_96 == '2');
                                                    auVar12[3] = -(cStack_95 == '5');
                                                    auVar12[4] = -(cStack_94 == '0');
                                                    auVar12[5] = -(cStack_93 == '7');
                                                    auVar12[6] = -(cStack_92 == '3');
                                                    auVar12[7] = -(cStack_91 == '8');
                                                    auVar12[8] = -(cStack_90 == '5');
                                                    auVar12[9] = -(cStack_8f == '8');
                                                    auVar12[10] = -(cStack_8e == '5');
                                                    auVar12[0xb] = -(cStack_8d == '0');
                                                    auVar12[0xc] = -(cStack_8c == '7');
                                                    auVar12[0xd] = -(cStack_8b == '2');
                                                    auVar12[0xe] = -(cStack_8a == '0');
                                                    auVar12[0xf] = -(cStack_89 == '0');
                                                    auVar12 = auVar12 & auVar21;
                                                    if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1
                                                                         ) |
                                                                 (ushort)(SUB161(auVar12 >> 0xf,0) &
                                                                         1) << 1 |
                                                                 (ushort)(SUB161(auVar12 >> 0x17,0)
                                                                         & 1) << 2 |
                                                                 (ushort)(SUB161(auVar12 >> 0x1f,0)
                                                                         & 1) << 3 |
                                                                 (ushort)(SUB161(auVar12 >> 0x27,0)
                                                                         & 1) << 4 |
                                                                 (ushort)(SUB161(auVar12 >> 0x2f,0)
                                                                         & 1) << 5 |
                                                                 (ushort)(SUB161(auVar12 >> 0x37,0)
                                                                         & 1) << 6 |
                                                                 (ushort)(SUB161(auVar12 >> 0x3f,0)
                                                                         & 1) << 7 |
                                                                 (ushort)(SUB161(auVar12 >> 0x47,0)
                                                                         & 1) << 8 |
                                                                 (ushort)(SUB161(auVar12 >> 0x4f,0)
                                                                         & 1) << 9 |
                                                                 (ushort)(SUB161(auVar12 >> 0x57,0)
                                                                         & 1) << 10 |
                                                                 (ushort)(SUB161(auVar12 >> 0x5f,0)
                                                                         & 1) << 0xb |
                                                                 (ushort)(SUB161(auVar12 >> 0x67,0)
                                                                         & 1) << 0xc |
                                                                 (ushort)(SUB161(auVar12 >> 0x6f,0)
                                                                         & 1) << 0xd |
                                                                 (ushort)(SUB161(auVar12 >> 0x77,0)
                                                                         & 1) << 0xe |
                                                                (ushort)(byte)(auVar12[0xf] >> 7) <<
                                                                0xf) != 0xffff) {
                                                      pcVar2 = "\"2225073858507200889\"";
                                                      pcVar4 = "2225073858507200889";
                                                      uVar3 = 0xdc;
                                                      goto LAB_00829abd;
                                                    }
                                                    if (local_a0 == -0x133) {
                                                      buffer_27._8_8_ = &local_9c;
                                                      buffer_27.start_ = (char *)0x64;
                                                      double_conversion::BignumDtoa
                                                                ((double_conversion *)0x0,
                                                                 4.128420500802942e-09,
                                                                 BIGNUM_DTOA_SHORTEST,(int)&local_98
                                                                 ,buffer_27,&local_a0,
                                                                 in_stack_ffffffffffffff58);
                                                      if ((local_88 != '\0' ||
                                                          CONCAT17(cStack_91,
                                                                   CONCAT16(cStack_92,
                                                                            CONCAT15(cStack_93,
                                                                                     CONCAT14(
                                                  cStack_94,
                                                  CONCAT13(cStack_95,
                                                           CONCAT12(cStack_96,
                                                                    CONCAT11(cStack_97,local_98)))))
                                                  )) != 0x3530323438323134) ||
                                                  CONCAT17(cStack_89,
                                                           CONCAT16(cStack_8a,
                                                                    CONCAT15(cStack_8b,
                                                                             CONCAT14(cStack_8c,
                                                                                      CONCAT13(
                                                  cStack_8d,
                                                  CONCAT12(cStack_8e,CONCAT11(cStack_8f,cStack_90)))
                                                  )))) != 0x3234393230383030) {
                                                    pcVar2 = "\"4128420500802942\"";
                                                    pcVar4 = "4128420500802942";
                                                    uVar3 = 0xe1;
                                                    goto LAB_00829abd;
                                                  }
                                                  if (local_a0 != -8) {
                                                    uVar25 = CONCAT44((int)((ulong)
                                                  in_stack_ffffffffffffff58 >> 0x20),local_a0);
                                                  pcVar2 = "-8";
                                                  uVar3 = 0xe2;
                                                  uVar5 = 0xfffffff8;
                                                  goto LAB_00829886;
                                                  }
                                                  buffer_28._8_8_ = &local_9c;
                                                  buffer_28.start_ = (char *)0x64;
                                                  double_conversion::BignumDtoa
                                                            ((double_conversion *)0x0,
                                                             3.9292015898194143e-10,
                                                             BIGNUM_DTOA_SHORTEST,(int)&local_98,
                                                             buffer_28,&local_a0,
                                                             in_stack_ffffffffffffff58);
                                                  auVar13[0] = -(local_98 == '3');
                                                  auVar13[1] = -(cStack_97 == '9');
                                                  auVar13[2] = -(cStack_96 == '2');
                                                  auVar13[3] = -(cStack_95 == '9');
                                                  auVar13[4] = -(cStack_94 == '2');
                                                  auVar13[5] = -(cStack_93 == '0');
                                                  auVar13[6] = -(cStack_92 == '1');
                                                  auVar13[7] = -(cStack_91 == '5');
                                                  auVar13[8] = -(cStack_90 == '8');
                                                  auVar13[9] = -(cStack_8f == '9');
                                                  auVar13[10] = -(cStack_8e == '8');
                                                  auVar13[0xb] = -(cStack_8d == '1');
                                                  auVar13[0xc] = -(cStack_8c == '9');
                                                  auVar13[0xd] = -(cStack_8b == '4');
                                                  auVar13[0xe] = -(cStack_8a == '1');
                                                  auVar13[0xf] = -(cStack_89 == '4');
                                                  auVar22[0] = -((char)_local_88 == '3');
                                                  auVar22[1] = -((char)((uint)_local_88 >> 8) ==
                                                                '\0');
                                                  auVar22[2] = 0xff;
                                                  auVar22[3] = 0xff;
                                                  auVar22[4] = 0xff;
                                                  auVar22[5] = 0xff;
                                                  auVar22[6] = 0xff;
                                                  auVar22[7] = 0xff;
                                                  auVar22[8] = 0xff;
                                                  auVar22[9] = 0xff;
                                                  auVar22[10] = 0xff;
                                                  auVar22[0xb] = 0xff;
                                                  auVar22[0xc] = 0xff;
                                                  auVar22[0xd] = 0xff;
                                                  auVar22[0xe] = 0xff;
                                                  auVar22[0xf] = 0xff;
                                                  auVar22 = auVar22 & auVar13;
                                                  if ((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1)
                                                               | (ushort)(SUB161(auVar22 >> 0xf,0) &
                                                                         1) << 1 |
                                                               (ushort)(SUB161(auVar22 >> 0x17,0) &
                                                                       1) << 2 |
                                                               (ushort)(SUB161(auVar22 >> 0x1f,0) &
                                                                       1) << 3 |
                                                               (ushort)(SUB161(auVar22 >> 0x27,0) &
                                                                       1) << 4 |
                                                               (ushort)(SUB161(auVar22 >> 0x2f,0) &
                                                                       1) << 5 |
                                                               (ushort)(SUB161(auVar22 >> 0x37,0) &
                                                                       1) << 6 |
                                                               (ushort)(SUB161(auVar22 >> 0x3f,0) &
                                                                       1) << 7 |
                                                               (ushort)(SUB161(auVar22 >> 0x47,0) &
                                                                       1) << 8 |
                                                               (ushort)(SUB161(auVar22 >> 0x4f,0) &
                                                                       1) << 9 |
                                                               (ushort)(SUB161(auVar22 >> 0x57,0) &
                                                                       1) << 10 |
                                                               (ushort)(SUB161(auVar22 >> 0x5f,0) &
                                                                       1) << 0xb |
                                                               (ushort)(SUB161(auVar22 >> 0x67,0) &
                                                                       1) << 0xc |
                                                               (ushort)(SUB161(auVar22 >> 0x6f,0) &
                                                                       1) << 0xd |
                                                               (ushort)(SUB161(auVar22 >> 0x77,0) &
                                                                       1) << 0xe |
                                                              (ushort)(byte)(auVar22[0xf] >> 7) <<
                                                              0xf) != 0xffff) {
                                                    pcVar2 = "\"39292015898194143\"";
                                                    pcVar4 = "39292015898194143";
                                                    uVar3 = 0xe6;
                                                    goto LAB_00829abd;
                                                  }
                                                  uVar3 = 5;
                                                  buffer_29._8_8_ = &local_9c;
                                                  buffer_29.start_ = (char *)0x64;
                                                  double_conversion::BignumDtoa
                                                            ((double_conversion *)0x2,4194304.0,5,
                                                             (int)&local_98,buffer_29,&local_a0,
                                                             in_stack_ffffffffffffff58);
                                                  if (5 < local_9c - local_a0) {
                                                    pcVar2 = "(5) >= (length - point)";
                                                    uVar3 = 0xea;
                                                    goto LAB_00829a85;
                                                  }
                                                  representation_14._8_8_ = uVar3;
                                                  representation_14.start_ = &local_98;
                                                  TrimRepresentation(representation_14);
                                                  if (CONCAT17(cStack_91,
                                                               CONCAT16(cStack_92,
                                                                        CONCAT15(cStack_93,
                                                                                 CONCAT14(cStack_94,
                                                                                          CONCAT13(
                                                  cStack_95,
                                                  CONCAT12(cStack_96,CONCAT11(cStack_97,local_98))))
                                                  ))) != 0x34303334393134) {
                                                    pcVar2 = "\"4194304\"";
                                                    pcVar4 = "4194304";
                                                    uVar3 = 0xec;
                                                    goto LAB_00829abd;
                                                  }
                                                  uVar3 = 0x13;
                                                  buffer_30._8_8_ = &local_9c;
                                                  buffer_30.start_ = (char *)0x64;
                                                  double_conversion::BignumDtoa
                                                            ((double_conversion *)0x3,
                                                             3.316133905216739e-237,0x13,
                                                             (int)&local_98,buffer_30,&local_a0,
                                                             in_stack_ffffffffffffff58);
                                                  if (0x13 < local_9c) {
                                                    pcVar2 = "(19) >= (length)";
                                                    uVar3 = 0xf0;
                                                    goto LAB_00829a85;
                                                  }
                                                  representation_15._8_8_ = uVar3;
                                                  representation_15.start_ = &local_98;
                                                  TrimRepresentation(representation_15);
                                                  auVar23[0] = -((char)_local_88 == '0');
                                                  auVar23[1] = -((char)((uint)_local_88 >> 8) == '5'
                                                                );
                                                  auVar23[2] = -((char)((uint)_local_88 >> 0x10) ==
                                                                '6');
                                                  auVar23[3] = -((char)((uint)_local_88 >> 0x18) ==
                                                                '\0');
                                                  auVar23[4] = 0xff;
                                                  auVar23[5] = 0xff;
                                                  auVar23[6] = 0xff;
                                                  auVar23[7] = 0xff;
                                                  auVar23[8] = 0xff;
                                                  auVar23[9] = 0xff;
                                                  auVar23[10] = 0xff;
                                                  auVar23[0xb] = 0xff;
                                                  auVar23[0xc] = 0xff;
                                                  auVar23[0xd] = 0xff;
                                                  auVar23[0xe] = 0xff;
                                                  auVar23[0xf] = 0xff;
                                                  auVar14[0] = -(local_98 == '3');
                                                  auVar14[1] = -(cStack_97 == '3');
                                                  auVar14[2] = -(cStack_96 == '1');
                                                  auVar14[3] = -(cStack_95 == '6');
                                                  auVar14[4] = -(cStack_94 == '1');
                                                  auVar14[5] = -(cStack_93 == '3');
                                                  auVar14[6] = -(cStack_92 == '3');
                                                  auVar14[7] = -(cStack_91 == '9');
                                                  auVar14[8] = -(cStack_90 == '0');
                                                  auVar14[9] = -(cStack_8f == '5');
                                                  auVar14[10] = -(cStack_8e == '2');
                                                  auVar14[0xb] = -(cStack_8d == '1');
                                                  auVar14[0xc] = -(cStack_8c == '6');
                                                  auVar14[0xd] = -(cStack_8b == '7');
                                                  auVar14[0xe] = -(cStack_8a == '3');
                                                  auVar14[0xf] = -(cStack_89 == '9');
                                                  auVar14 = auVar14 & auVar23;
                                                  if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1)
                                                               | (ushort)(SUB161(auVar14 >> 0xf,0) &
                                                                         1) << 1 |
                                                               (ushort)(SUB161(auVar14 >> 0x17,0) &
                                                                       1) << 2 |
                                                               (ushort)(SUB161(auVar14 >> 0x1f,0) &
                                                                       1) << 3 |
                                                               (ushort)(SUB161(auVar14 >> 0x27,0) &
                                                                       1) << 4 |
                                                               (ushort)(SUB161(auVar14 >> 0x2f,0) &
                                                                       1) << 5 |
                                                               (ushort)(SUB161(auVar14 >> 0x37,0) &
                                                                       1) << 6 |
                                                               (ushort)(SUB161(auVar14 >> 0x3f,0) &
                                                                       1) << 7 |
                                                               (ushort)(SUB161(auVar14 >> 0x47,0) &
                                                                       1) << 8 |
                                                               (ushort)(SUB161(auVar14 >> 0x4f,0) &
                                                                       1) << 9 |
                                                               (ushort)(SUB161(auVar14 >> 0x57,0) &
                                                                       1) << 10 |
                                                               (ushort)(SUB161(auVar14 >> 0x5f,0) &
                                                                       1) << 0xb |
                                                               (ushort)(SUB161(auVar14 >> 0x67,0) &
                                                                       1) << 0xc |
                                                               (ushort)(SUB161(auVar14 >> 0x6f,0) &
                                                                       1) << 0xd |
                                                               (ushort)(SUB161(auVar14 >> 0x77,0) &
                                                                       1) << 0xe |
                                                              (ushort)(byte)(auVar14[0xf] >> 7) <<
                                                              0xf) != 0xffff) {
                                                    pcVar2 = "\"3316133905216739056\"";
                                                    pcVar4 = "3316133905216739056";
                                                    uVar3 = 0xf2;
                                                    goto LAB_00829abd;
                                                  }
                                                  if (local_a0 == -0xec) {
                                                    uVar3 = 4;
                                                    buffer_31._8_8_ = &local_9c;
                                                    buffer_31.start_ = (char *)0x64;
                                                    double_conversion::BignumDtoa
                                                              ((double_conversion *)0x3,
                                                               7.98851839160081e+191,4,
                                                               (int)&local_98,buffer_31,&local_a0,
                                                               in_stack_ffffffffffffff58);
                                                    if (4 < local_9c) {
                                                      pcVar2 = "(4) >= (length)";
                                                      uVar3 = 0xf7;
                                                      goto LAB_00829a85;
                                                    }
                                                    representation_16._8_8_ = uVar3;
                                                    representation_16.start_ = &local_98;
                                                    TrimRepresentation(representation_16);
                                                    if (cStack_94 != '\0' ||
                                                        CONCAT13(cStack_95,
                                                                 CONCAT12(cStack_96,
                                                                          CONCAT11(cStack_97,
                                                                                   local_98))) !=
                                                        0x39383937) {
                                                      pcVar2 = "\"7989\"";
                                                      pcVar4 = "7989";
                                                      uVar3 = 0xf9;
                                                      goto LAB_00829abd;
                                                    }
                                                    if (local_a0 == 0xc0) {
                                                      uVar3 = 1;
                                                      buffer_32._8_8_ = &local_9c;
                                                      buffer_32.start_ = (char *)0x64;
                                                      double_conversion::BignumDtoa
                                                                ((double_conversion *)0x2,
                                                                 1.0000000000000013e+17,
                                                                 BIGNUM_DTOA_SHORTEST_SINGLE,
                                                                 (int)&local_98,buffer_32,&local_a0,
                                                                 in_stack_ffffffffffffff58);
                                                      uVar26 = (undefined4)
                                                               ((ulong)in_stack_ffffffffffffff58 >>
                                                               0x20);
                                                      if (1 < local_9c - local_a0) {
                                                        pcVar2 = "(1) >= (length - point)";
                                                        uVar3 = 0xfe;
                                                        goto LAB_00829a85;
                                                      }
                                                      representation_17._8_8_ = uVar3;
                                                      representation_17.start_ = &local_98;
                                                      TrimRepresentation(representation_17);
                                                      auVar24[0] = -(cStack_95 == '0');
                                                      auVar24[1] = -(cStack_94 == '0');
                                                      auVar24[2] = -(cStack_93 == '0');
                                                      auVar24[3] = -(cStack_92 == '0');
                                                      auVar24[4] = -(cStack_91 == '0');
                                                      auVar24[5] = -(cStack_90 == '0');
                                                      auVar24[6] = -(cStack_8f == '0');
                                                      auVar24[7] = -(cStack_8e == '0');
                                                      auVar24[8] = -(cStack_8d == '0');
                                                      auVar24[9] = -(cStack_8c == '0');
                                                      auVar24[10] = -(cStack_8b == '0');
                                                      auVar24[0xb] = -(cStack_8a == '0');
                                                      auVar24[0xc] = -(cStack_89 == '1');
                                                      auVar24[0xd] = -(local_88 == '2');
                                                      auVar24[0xe] = -(cStack_87 == '8');
                                                      auVar24[0xf] = -(cStack_86 == '\0');
                                                      auVar15[0] = -(local_98 == '1');
                                                      auVar15[1] = -(cStack_97 == '0');
                                                      auVar15[2] = -(cStack_96 == '0');
                                                      auVar15[3] = -(cStack_95 == '0');
                                                      auVar15[4] = -(cStack_94 == '0');
                                                      auVar15[5] = -(cStack_93 == '0');
                                                      auVar15[6] = -(cStack_92 == '0');
                                                      auVar15[7] = -(cStack_91 == '0');
                                                      auVar15[8] = -(cStack_90 == '0');
                                                      auVar15[9] = -(cStack_8f == '0');
                                                      auVar15[10] = -(cStack_8e == '0');
                                                      auVar15[0xb] = -(cStack_8d == '0');
                                                      auVar15[0xc] = -(cStack_8c == '0');
                                                      auVar15[0xd] = -(cStack_8b == '0');
                                                      auVar15[0xe] = -(cStack_8a == '0');
                                                      auVar15[0xf] = -(cStack_89 == '1');
                                                      auVar15 = auVar15 & auVar24;
                                                      if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) &
                                                                           1) |
                                                                   (ushort)(SUB161(auVar15 >> 0xf,0)
                                                                           & 1) << 1 |
                                                                   (ushort)(SUB161(auVar15 >> 0x17,0
                                                                                  ) & 1) << 2 |
                                                                   (ushort)(SUB161(auVar15 >> 0x1f,0
                                                                                  ) & 1) << 3 |
                                                                   (ushort)(SUB161(auVar15 >> 0x27,0
                                                                                  ) & 1) << 4 |
                                                                   (ushort)(SUB161(auVar15 >> 0x2f,0
                                                                                  ) & 1) << 5 |
                                                                   (ushort)(SUB161(auVar15 >> 0x37,0
                                                                                  ) & 1) << 6 |
                                                                   (ushort)(SUB161(auVar15 >> 0x3f,0
                                                                                  ) & 1) << 7 |
                                                                   (ushort)(SUB161(auVar15 >> 0x47,0
                                                                                  ) & 1) << 8 |
                                                                   (ushort)(SUB161(auVar15 >> 0x4f,0
                                                                                  ) & 1) << 9 |
                                                                   (ushort)(SUB161(auVar15 >> 0x57,0
                                                                                  ) & 1) << 10 |
                                                                   (ushort)(SUB161(auVar15 >> 0x5f,0
                                                                                  ) & 1) << 0xb |
                                                                   (ushort)(SUB161(auVar15 >> 0x67,0
                                                                                  ) & 1) << 0xc |
                                                                   (ushort)(SUB161(auVar15 >> 0x6f,0
                                                                                  ) & 1) << 0xd |
                                                                   (ushort)(SUB161(auVar15 >> 0x77,0
                                                                                  ) & 1) << 0xe |
                                                                  (ushort)(byte)(auVar15[0xf] >> 7)
                                                                  << 0xf) != 0xffff) {
                                                        pcVar2 = "\"100000000000000128\"";
                                                        pcVar4 = "100000000000000128";
                                                        uVar3 = 0x100;
                                                        goto LAB_00829abd;
                                                      }
                                                      if (local_a0 == 0x12) {
                                                        return;
                                                      }
                                                      uVar25 = CONCAT44(uVar26,local_a0);
                                                      pcVar2 = "18";
                                                      uVar3 = 0x101;
                                                      uVar5 = 0x12;
                                                    }
                                                    else {
                                                      uVar25 = CONCAT44((int)((ulong)
                                                  in_stack_ffffffffffffff58 >> 0x20),local_a0);
                                                  pcVar2 = "192";
                                                  uVar3 = 0xfa;
                                                  uVar5 = 0xc0;
                                                  }
                                                  }
                                                  else {
                                                    uVar25 = CONCAT44((int)((ulong)
                                                  in_stack_ffffffffffffff58 >> 0x20),local_a0);
                                                  pcVar2 = "-236";
                                                  uVar3 = 0xf3;
                                                  uVar5 = 0xffffff14;
                                                  }
                                                  goto LAB_00829886;
                                                  }
                                                  uVar25 = CONCAT44((int)((ulong)
                                                  in_stack_ffffffffffffff58 >> 0x20),local_a0);
                                                  uVar3 = 0xdd;
                                                  }
                                                  else {
                                                    uVar25 = CONCAT44((int)((ulong)
                                                  in_stack_ffffffffffffff58 >> 0x20),local_a0);
                                                  uVar3 = 0xd7;
                                                  }
                                                }
                                                else {
                                                  uVar25 = CONCAT44((int)((ulong)
                                                  in_stack_ffffffffffffff58 >> 0x20),local_a0);
                                                  uVar3 = 0xd1;
                                                }
                                              }
                                              else {
                                                uVar25 = CONCAT44((int)((ulong)
                                                  in_stack_ffffffffffffff58 >> 0x20),local_a0);
                                                uVar3 = 0xcb;
                                              }
                                              pcVar2 = "-307";
                                              uVar5 = 0xfffffecd;
                                              goto LAB_00829886;
                                            }
                                            uVar25 = CONCAT44((int)((ulong)in_stack_ffffffffffffff58
                                                                   >> 0x20),local_a0);
                                            uVar3 = 0xc0;
                                          }
                                          else {
                                            uVar25 = CONCAT44((int)((ulong)in_stack_ffffffffffffff58
                                                                   >> 0x20),local_a0);
                                            uVar3 = 0xb9;
                                          }
                                          goto LAB_00829677;
                                        }
                                        uVar25 = CONCAT44((int)((ulong)in_stack_ffffffffffffff58 >>
                                                               0x20),local_a0);
                                        uVar3 = 0xb4;
                                      }
                                      else {
                                        uVar25 = CONCAT44((int)((ulong)in_stack_ffffffffffffff58 >>
                                                               0x20),iVar1);
                                        uVar3 = 0xad;
                                      }
                                    }
                                    else {
                                      uVar25 = CONCAT44((int)((ulong)in_stack_ffffffffffffff58 >>
                                                             0x20),local_a0);
                                      uVar3 = 0xa5;
                                    }
                                    goto LAB_008295a1;
                                  }
                                  uVar25 = CONCAT44((int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                                                    local_a0);
                                  uVar3 = 0xa0;
                                }
                                else {
                                  uVar25 = CONCAT44((int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                                                    local_a0);
                                  uVar3 = 0x99;
                                }
                                pcVar2 = "-308";
                                uVar5 = 0xfffffecc;
                                goto LAB_00829886;
                              }
                              uVar25 = CONCAT44((int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                                                local_a0);
                              uVar3 = 0x94;
                            }
                            else {
                              uVar25 = CONCAT44((int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                                                local_a0);
                              uVar3 = 0x8d;
                            }
LAB_00829677:
                            pcVar2 = "299";
                            uVar5 = 299;
                            goto LAB_00829886;
                          }
                          uVar25 = CONCAT44((int)((ulong)in_stack_ffffffffffffff58 >> 0x20),local_a0
                                           );
                          uVar3 = 0x88;
                        }
                        else {
                          uVar25 = CONCAT44((int)((ulong)in_stack_ffffffffffffff58 >> 0x20),local_a0
                                           );
                          uVar3 = 0x81;
                        }
                      }
                      else {
                        uVar25 = CONCAT44((int)((ulong)in_stack_ffffffffffffff58 >> 0x20),local_a0);
                        uVar3 = 0x7d;
                      }
LAB_008295a1:
                      pcVar2 = "10";
                      uVar5 = 10;
                      goto LAB_00829886;
                    }
                    uVar25 = CONCAT44((int)((ulong)in_stack_ffffffffffffff58 >> 0x20),local_a0);
                    uVar3 = 0x79;
                  }
                  else {
                    uVar25 = CONCAT44((int)((ulong)in_stack_ffffffffffffff58 >> 0x20),local_a0);
                    uVar3 = 0x73;
                  }
                  pcVar2 = "309";
                  uVar5 = 0x135;
                  goto LAB_00829886;
                }
                uVar25 = CONCAT44((int)((ulong)in_stack_ffffffffffffff58 >> 0x20),local_a0);
                uVar3 = 0x6e;
              }
              else {
                uVar25 = CONCAT44((int)((ulong)in_stack_ffffffffffffff58 >> 0x20),local_a0);
                uVar3 = 99;
              }
              pcVar2 = "-323";
              uVar5 = 0xfffffebd;
              goto LAB_00829886;
            }
            uVar25 = CONCAT44((int)((ulong)in_stack_ffffffffffffff58 >> 0x20),local_a0);
            uVar3 = 0x5e;
          }
          else {
            uVar25 = CONCAT44((int)((ulong)in_stack_ffffffffffffff58 >> 0x20),iVar1);
            uVar3 = 0x58;
          }
        }
        else {
          uVar25 = CONCAT44((int)((ulong)in_stack_ffffffffffffff58 >> 0x20),local_a0);
          uVar3 = 0x52;
        }
      }
      else {
        uVar25 = CONCAT44((int)((ulong)in_stack_ffffffffffffff58 >> 0x20),local_a0);
        uVar3 = 0x4e;
      }
    }
    else {
      uVar25 = CONCAT44((int)((ulong)in_stack_ffffffffffffff58 >> 0x20),iVar1);
      uVar3 = 0x48;
    }
  }
  else {
    uVar25 = CONCAT44((int)((ulong)in_stack_ffffffffffffff58 >> 0x20),local_a0);
    uVar3 = 0x42;
  }
  pcVar2 = "1";
  uVar5 = 1;
LAB_00829886:
  printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %d\n#  Found:    %d\n",
         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/ext/double-conversion/test/cctest/test-bignum-dtoa.cc"
         ,uVar3,pcVar2,"point",uVar5,uVar25);
  abort();
}

Assistant:

TEST(BignumDtoaVariousDoubles) {
  char buffer_container[kBufferSize];
  Vector<char> buffer(buffer_container, kBufferSize);
  int length;
  int point;

  BignumDtoa(1.0, BIGNUM_DTOA_SHORTEST, 0, buffer, &length, &point);
  CHECK_EQ("1", buffer.start());
  CHECK_EQ(1, point);

  BignumDtoa(1.0, BIGNUM_DTOA_FIXED, 3, buffer, &length, &point);
  CHECK_GE(3, length - point);
  TrimRepresentation(buffer);
  CHECK_EQ("1", buffer.start());
  CHECK_EQ(1, point);

  BignumDtoa(1.0, BIGNUM_DTOA_PRECISION, 3, buffer, &length, &point);
  CHECK_GE(3, length);
  TrimRepresentation(buffer);
  CHECK_EQ("1", buffer.start());
  CHECK_EQ(1, point);

  BignumDtoa(1.5, BIGNUM_DTOA_SHORTEST, 0, buffer, &length, &point);
  CHECK_EQ("15", buffer.start());
  CHECK_EQ(1, point);

  BignumDtoa(1.5, BIGNUM_DTOA_FIXED, 10, buffer, &length, &point);
  CHECK_GE(10, length - point);
  TrimRepresentation(buffer);
  CHECK_EQ("15", buffer.start());
  CHECK_EQ(1, point);

  BignumDtoa(1.5, BIGNUM_DTOA_PRECISION, 10, buffer, &length, &point);
  CHECK_GE(10, length);
  TrimRepresentation(buffer);
  CHECK_EQ("15", buffer.start());
  CHECK_EQ(1, point);

  double min_double = 5e-324;
  BignumDtoa(min_double, BIGNUM_DTOA_SHORTEST, 0, buffer, &length, &point);
  CHECK_EQ("5", buffer.start());
  CHECK_EQ(-323, point);

  BignumDtoa(min_double, BIGNUM_DTOA_FIXED, 5, buffer, &length, &point);
  CHECK_GE(5, length - point);
  TrimRepresentation(buffer);
  CHECK_EQ("", buffer.start());

  BignumDtoa(min_double, BIGNUM_DTOA_PRECISION, 5, buffer, &length, &point);
  CHECK_GE(5, length);
  TrimRepresentation(buffer);
  CHECK_EQ("49407", buffer.start());
  CHECK_EQ(-323, point);

  double max_double = 1.7976931348623157e308;
  BignumDtoa(max_double, BIGNUM_DTOA_SHORTEST, 0, buffer, &length, &point);
  CHECK_EQ("17976931348623157", buffer.start());
  CHECK_EQ(309, point);

  BignumDtoa(max_double, BIGNUM_DTOA_PRECISION, 7, buffer, &length, &point);
  CHECK_GE(7, length);
  TrimRepresentation(buffer);
  CHECK_EQ("1797693", buffer.start());
  CHECK_EQ(309, point);

  BignumDtoa(4294967272.0, BIGNUM_DTOA_SHORTEST, 0, buffer, &length, &point);
  CHECK_EQ("4294967272", buffer.start());
  CHECK_EQ(10, point);

  BignumDtoa(4294967272.0, BIGNUM_DTOA_FIXED, 5, buffer, &length, &point);
  CHECK_EQ("429496727200000", buffer.start());
  CHECK_EQ(10, point);


  BignumDtoa(4294967272.0, BIGNUM_DTOA_PRECISION, 14, buffer, &length, &point);
  CHECK_GE(14, length);
  TrimRepresentation(buffer);
  CHECK_EQ("4294967272", buffer.start());
  CHECK_EQ(10, point);

  BignumDtoa(4.1855804968213567e298, BIGNUM_DTOA_SHORTEST, 0,
             buffer, &length, &point);
  CHECK_EQ("4185580496821357", buffer.start());
  CHECK_EQ(299, point);

  BignumDtoa(4.1855804968213567e298, BIGNUM_DTOA_PRECISION, 20,
             buffer, &length, &point);
  CHECK_GE(20, length);
  TrimRepresentation(buffer);
  CHECK_EQ("41855804968213567225", buffer.start());
  CHECK_EQ(299, point);

  BignumDtoa(5.5626846462680035e-309, BIGNUM_DTOA_SHORTEST, 0,
             buffer, &length, &point);
  CHECK_EQ("5562684646268003", buffer.start());
  CHECK_EQ(-308, point);

  BignumDtoa(5.5626846462680035e-309, BIGNUM_DTOA_PRECISION, 1,
             buffer, &length, &point);
  CHECK_GE(1, length);
  TrimRepresentation(buffer);
  CHECK_EQ("6", buffer.start());
  CHECK_EQ(-308, point);

  BignumDtoa(2147483648.0, BIGNUM_DTOA_SHORTEST, 0,
             buffer, &length, &point);
  CHECK_EQ("2147483648", buffer.start());
  CHECK_EQ(10, point);


  BignumDtoa(2147483648.0, BIGNUM_DTOA_FIXED, 2,
             buffer, &length, &point);
  CHECK_GE(2, length - point);
  TrimRepresentation(buffer);
  CHECK_EQ("2147483648", buffer.start());
  CHECK_EQ(10, point);

  BignumDtoa(2147483648.0, BIGNUM_DTOA_PRECISION, 5,
             buffer, &length, &point);
  CHECK_GE(5, length);
  TrimRepresentation(buffer);
  CHECK_EQ("21475", buffer.start());
  CHECK_EQ(10, point);

  BignumDtoa(3.5844466002796428e+298, BIGNUM_DTOA_SHORTEST, 0,
             buffer, &length, &point);
  CHECK_EQ("35844466002796428", buffer.start());
  CHECK_EQ(299, point);

  BignumDtoa(3.5844466002796428e+298, BIGNUM_DTOA_PRECISION, 10,
             buffer, &length, &point);
  CHECK_GE(10, length);
  TrimRepresentation(buffer);
  CHECK_EQ("35844466", buffer.start());
  CHECK_EQ(299, point);

  BignumDtoa(1e-23, BIGNUM_DTOA_SHORTEST, 0,
             buffer, &length, &point);
  CHECK_EQ("1", buffer.start());
  CHECK_EQ(-22, point);

  uint64_t smallest_normal64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x00100000, 00000000);
  double v = Double(smallest_normal64).value();
  BignumDtoa(v, BIGNUM_DTOA_SHORTEST, 0, buffer, &length, &point);
  CHECK_EQ("22250738585072014", buffer.start());
  CHECK_EQ(-307, point);

  BignumDtoa(v, BIGNUM_DTOA_PRECISION, 20, buffer, &length, &point);
  CHECK_GE(20, length);
  TrimRepresentation(buffer);
  CHECK_EQ("22250738585072013831", buffer.start());
  CHECK_EQ(-307, point);

  uint64_t largest_denormal64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x000FFFFF, FFFFFFFF);
  v = Double(largest_denormal64).value();
  BignumDtoa(v, BIGNUM_DTOA_SHORTEST, 0, buffer, &length, &point);
  CHECK_EQ("2225073858507201", buffer.start());
  CHECK_EQ(-307, point);

  BignumDtoa(v, BIGNUM_DTOA_PRECISION, 20, buffer, &length, &point);
  CHECK_GE(20, length);
  TrimRepresentation(buffer);
  CHECK_EQ("2225073858507200889", buffer.start());
  CHECK_EQ(-307, point);

  BignumDtoa(4128420500802942e-24, BIGNUM_DTOA_SHORTEST, 0,
             buffer, &length, &point);
  CHECK_EQ("4128420500802942", buffer.start());
  CHECK_EQ(-8, point);

  v = 3.9292015898194142585311918e-10;
  BignumDtoa(v, BIGNUM_DTOA_SHORTEST, 0, buffer, &length, &point);
  CHECK_EQ("39292015898194143", buffer.start());

  v = 4194304.0;
  BignumDtoa(v, BIGNUM_DTOA_FIXED, 5, buffer, &length, &point);
  CHECK_GE(5, length - point);
  TrimRepresentation(buffer);
  CHECK_EQ("4194304", buffer.start());

  v = 3.3161339052167390562200598e-237;
  BignumDtoa(v, BIGNUM_DTOA_PRECISION, 19, buffer, &length, &point);
  CHECK_GE(19, length);
  TrimRepresentation(buffer);
  CHECK_EQ("3316133905216739056", buffer.start());
  CHECK_EQ(-236, point);

  v = 7.9885183916008099497815232e+191;
  BignumDtoa(v, BIGNUM_DTOA_PRECISION, 4, buffer, &length, &point);
  CHECK_GE(4, length);
  TrimRepresentation(buffer);
  CHECK_EQ("7989", buffer.start());
  CHECK_EQ(192, point);

  v = 1.0000000000000012800000000e+17;
  BignumDtoa(v, BIGNUM_DTOA_FIXED, 1, buffer, &length, &point);
  CHECK_GE(1, length - point);
  TrimRepresentation(buffer);
  CHECK_EQ("100000000000000128", buffer.start());
  CHECK_EQ(18, point);
}